

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O1

string * __thiscall
SL::WS_LITE::Base64decode<std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,WS_LITE *this,
          basic_string_view<char,_std::char_traits<char>_> *base64)

{
  int iVar1;
  BIO_METHOD *type;
  BIO *b;
  BIO *pBVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)((ulong)(*(long *)this * 6) >> 3));
  type = BIO_f_base64();
  b = BIO_new(type);
  BIO_set_flags(b,0x100);
  pBVar2 = BIO_new_mem_buf(*(void **)(this + 8),*(int *)this);
  pBVar2 = BIO_push(b,pBVar2);
  iVar1 = BIO_read(pBVar2,(__return_storage_ptr__->_M_dataplus)._M_p,
                   (int)__return_storage_ptr__->_M_string_length);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)iVar1);
  BIO_free_all(b);
  return __return_storage_ptr__;
}

Assistant:

std::string Base64decode(const type &base64)
    {
        // Resize ascii, however, the size is a up to two bytes too large.
        std::string ascii;
        ascii.resize((6 * base64.size()) / 8);
        BIO *b64, *bio;

        b64 = BIO_new(BIO_f_base64());
        BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);
        bio = BIO_new_mem_buf((char *)&base64[0], static_cast<int>(base64.size()));
        bio = BIO_push(b64, bio);

        int decoded_length = BIO_read(bio, &ascii[0], static_cast<int>(ascii.size()));
        ascii.resize(decoded_length);

        BIO_free_all(b64);
        return ascii;
    }